

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O0

void __thiscall
anurbs::TrimmedSurfaceClipping::add_curve(TrimmedSurfaceClipping *this,CurveBase<2L> *curve)

{
  cInt cVar1;
  bool bVar2;
  type *container;
  Index IVar3;
  const_reference point;
  reference a;
  IntPoint IVar4;
  undefined1 local_78 [8];
  IntPoint pt;
  Index i;
  type *points;
  type *ts;
  reference local_20;
  Path *path;
  CurveBase<2L> *curve_local;
  TrimmedSurfaceClipping *this_local;
  
  path = (Path *)curve;
  curve_local = (CurveBase<2L> *)this;
  local_20 = std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::back(&this->m_paths);
  CurveTessellation<2L>::compute
            ((pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
              *)&ts,(CurveBaseD *)path,this->m_tolerance);
  std::
  get<0ul,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
            ((pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
              *)&ts);
  container = std::
              get<1ul,std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                        ((pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          *)&ts);
  pt.Y = 0;
  do {
    cVar1 = pt.Y;
    IVar3 = length<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                      (container);
    if (IVar3 <= cVar1) {
      std::
      pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
      ::~pair((pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
               *)&ts);
      return;
    }
    point = std::
            vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ::operator[](container,pt.Y);
    IVar4 = to_int_pt(this,point);
    pt.X = IVar4.Y;
    local_78 = (undefined1  [8])IVar4.X;
    if (pt.Y == 0) {
      IVar3 = length<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>
                        (local_20);
      IVar4.Y = pt.X;
      IVar4.X = (cInt)local_78;
      if (IVar3 < 1) goto LAB_002ec466;
      a = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::back(local_20);
      bVar2 = ClipperLib::operator==(a,(IntPoint *)local_78);
      IVar4.Y = pt.X;
      IVar4.X = (cInt)local_78;
      if (!bVar2) goto LAB_002ec466;
    }
    else {
LAB_002ec466:
      pt.X = IVar4.Y;
      local_78 = (undefined1  [8])IVar4.X;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                (local_20,(value_type *)local_78);
    }
    pt.Y = pt.Y + 1;
  } while( true );
}

Assistant:

void add_curve(CurveBase<2>& curve)
    {
        ClipperLib::Path& path = m_paths.back();

        const auto [ts, points] = CurveTessellation<2>::compute(curve, m_tolerance);

        for (Index i = 0; i < length(points); i++) {
            auto pt = to_int_pt(points[i]);

            if (i == 0 && length(path) > 0 && path.back() == pt) {
                continue;
            }

            path.push_back(pt);
        }
    }